

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O3

string * mask_to_string_abi_cxx11_(string *__return_storage_ptr__,uint64_t mask)

{
  int iVar1;
  long lVar2;
  ostringstream ss;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar1 = 0;
  lVar2 = 0x40;
  do {
    if ((mask >> ((ulong)((int)lVar2 - 1U & 0xff) & 0x3f) & 1) == 0) {
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        local_1a9 = '0';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      }
    }
    else {
      local_1a9 = '1';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      if (iVar1 == 0) {
        iVar1 = (int)lVar2;
      }
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string
mask_to_string(uint64_t mask)
{
    std::ostringstream ss;
    unsigned len = 0;
    unsigned v = 0;
    unsigned i = 64;
    while (i--)
    {
        v = mask >> i;
        if (1ULL & v)
        {
            if (len == 0) len = i + 1;
            ss << '1';
        }
        else
            if (len > 0) ss << '0';
    }
    return ss.str();
}